

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QFileInfo>::end(QList<QFileInfo> *this)

{
  QFileInfo *n;
  QArrayDataPointer<QFileInfo> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QFileInfo> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QFileInfo> *)0x13f629);
  QArrayDataPointer<QFileInfo>::operator->(in_RDI);
  n = QArrayDataPointer<QFileInfo>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }